

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlChar * xmlNodeGetLang(xmlNode *cur)

{
  xmlChar *pxVar1;
  xmlChar *lang;
  xmlNode *cur_local;
  
  if ((cur != (xmlNode *)0x0) && (lang = (xmlChar *)cur, cur->type != XML_NAMESPACE_DECL)) {
    for (; lang != (xmlChar *)0x0; lang = *(xmlChar **)(lang + 0x28)) {
      pxVar1 = xmlGetNsProp((xmlNode *)lang,"lang",(xmlChar *)"http://www.w3.org/XML/1998/namespace"
                           );
      if (pxVar1 != (xmlChar *)0x0) {
        return pxVar1;
      }
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlNodeGetLang(const xmlNode *cur) {
    xmlChar *lang;

    if ((cur == NULL) || (cur->type == XML_NAMESPACE_DECL))
        return(NULL);
    while (cur != NULL) {
        lang = xmlGetNsProp(cur, BAD_CAST "lang", XML_XML_NAMESPACE);
	if (lang != NULL)
	    return(lang);
	cur = cur->parent;
    }
    return(NULL);
}